

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O3

int cdef_filter_block_worker_hook(void *arg1,void *arg2)

{
  uint uVar1;
  int iVar2;
  pthread_mutex_t *__mutex;
  CdefSearchCtx *cdef_search_ctx;
  CommonModeInfoParams *pCVar3;
  MB_MODE_INFO **ppMVar4;
  MB_MODE_INFO *pMVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  MB_MODE_INFO **ppMVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int sb_count;
  int cur_fbc;
  int cur_fbr;
  
  __mutex = *arg2;
  cdef_search_ctx = *(CdefSearchCtx **)(*arg1 + 0x42c28);
  iVar7 = _setjmp((__jmp_buf_tag *)((long)arg1 + 0xf0));
  if (iVar7 == 0) {
    *(undefined4 *)((long)arg1 + 0xe8) = 1;
    pthread_mutex_lock(*arg2);
    if (*(char *)((long)arg2 + 0x1c) == '\0') {
LAB_001cad75:
      if (*(int *)((long)arg2 + 0x10) == 0) {
        uVar1 = cdef_search_ctx->nvfb;
        uVar10 = cdef_search_ctx->nhfb;
        pCVar3 = cdef_search_ctx->mi_params;
        ppMVar4 = pCVar3->mi_grid_base;
        iVar7 = pCVar3->mi_stride;
        iVar2 = pCVar3->mi_rows;
        uVar9 = *(uint *)((long)arg2 + 0x14);
        uVar8 = *(uint *)((long)arg2 + 0x18);
        iVar11 = iVar7 * 0x10 * uVar9;
        do {
          iVar17 = iVar2 + uVar9 * -0x10;
          iVar14 = 0x10;
          if (iVar17 < 0x10) {
            iVar14 = iVar17;
          }
          iVar20 = 1;
          if (1 < iVar14) {
            iVar20 = iVar14;
          }
          iVar18 = uVar8 * 0x10;
          iVar19 = uVar8 * -0x10;
          do {
            if (0 < iVar17) {
              uVar12 = pCVar3->mi_cols + iVar19;
              if (0xf < (int)uVar12) {
                uVar12 = 0x10;
              }
              if ((int)uVar12 < 2) {
                uVar12 = 1;
              }
              iVar13 = 0;
              ppMVar15 = ppMVar4 + (long)iVar11 + (long)iVar18;
              pMVar5 = ppMVar4[(int)(uVar8 * 0x10 + iVar7 * uVar9 * 0x10)];
              bVar6 = false;
              do {
                if (0 < (int)(pCVar3->mi_cols + uVar8 * -0x10)) {
                  uVar16 = 0;
                  do {
                    if (ppMVar15[uVar16]->skip_txfm == '\0') goto LAB_001caecf;
                    uVar16 = uVar16 + 1;
                  } while (uVar12 != uVar16);
                }
                iVar13 = iVar13 + 1;
                bVar6 = iVar14 <= iVar13;
                ppMVar15 = ppMVar15 + iVar7;
              } while (iVar13 != iVar20);
LAB_001caecf:
              if (((!bVar6) &&
                  (((uVar8 & 1) == 0 || ((pMVar5->bsize & ~BLOCK_4X8) != BLOCK_128X64)))) &&
                 (((uVar9 & 1) == 0 || ((pMVar5->bsize - BLOCK_64X128 & 0xfd) != 0)))) {
                iVar7 = *(int *)((long)arg2 + 0x14);
                iVar2 = *(int *)((long)arg2 + 0x18);
                iVar11 = cdef_search_ctx->sb_count;
                cdef_search_ctx->sb_count = iVar11 + 1;
                uVar9 = iVar2 + 1;
                *(uint *)((long)arg2 + 0x18) = uVar9;
                if (uVar9 == uVar10) {
                  uVar10 = iVar7 + 1;
                  *(uint *)((long)arg2 + 0x14) = uVar10;
                  if (uVar10 == uVar1) {
                    *(undefined4 *)((long)arg2 + 0x10) = 1;
                  }
                  else {
                    *(undefined4 *)((long)arg2 + 0x18) = 0;
                  }
                }
                pthread_mutex_unlock(*arg2);
                av1_cdef_mse_calc_block
                          (cdef_search_ctx,(aom_internal_error_info *)((long)arg1 + 0x18),iVar7,
                           iVar2,iVar11);
                pthread_mutex_lock(*arg2);
                if (*(char *)((long)arg2 + 0x1c) == '\x01') goto LAB_001cafe0;
                goto LAB_001cad75;
              }
            }
            uVar8 = uVar8 + 1;
            *(uint *)((long)arg2 + 0x18) = uVar8;
            iVar19 = iVar19 + -0x10;
            iVar18 = iVar18 + 0x10;
          } while (uVar8 != uVar10);
          uVar9 = uVar9 + 1;
          *(uint *)((long)arg2 + 0x14) = uVar9;
          if (uVar9 == uVar1) {
            *(undefined4 *)((long)arg2 + 0x10) = 1;
            break;
          }
          *(undefined4 *)((long)arg2 + 0x18) = 0;
          iVar11 = iVar11 + iVar7 * 0x10;
          uVar8 = 0;
        } while( true );
      }
    }
LAB_001cafe0:
    pthread_mutex_unlock(*arg2);
    *(undefined4 *)((long)arg1 + 0xe8) = 0;
    iVar7 = 1;
  }
  else {
    *(undefined4 *)((long)arg1 + 0xe8) = 0;
    pthread_mutex_lock(__mutex);
    *(undefined1 *)((long)arg2 + 0x1c) = 1;
    pthread_mutex_unlock(__mutex);
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

static int cdef_filter_block_worker_hook(void *arg1, void *arg2) {
  EncWorkerData *thread_data = (EncWorkerData *)arg1;
  AV1CdefSync *const cdef_sync = (AV1CdefSync *)arg2;

#if CONFIG_MULTITHREAD
  pthread_mutex_t *cdef_mutex_ = cdef_sync->mutex_;
#endif
  struct aom_internal_error_info *const error_info = &thread_data->error_info;
  CdefSearchCtx *cdef_search_ctx = thread_data->cpi->cdef_search_ctx;

  // The jmp_buf is valid only for the duration of the function that calls
  // setjmp(). Therefore, this function must reset the 'setjmp' field to 0
  // before it returns.
  if (setjmp(error_info->jmp)) {
    error_info->setjmp = 0;
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(cdef_mutex_);
    cdef_sync->cdef_mt_exit = true;
    pthread_mutex_unlock(cdef_mutex_);
#endif
    return 0;
  }
  error_info->setjmp = 1;

  volatile int cur_fbr, cur_fbc, sb_count;
  while (cdef_get_next_job(cdef_sync, cdef_search_ctx, &cur_fbr, &cur_fbc,
                           &sb_count)) {
    av1_cdef_mse_calc_block(cdef_search_ctx, error_info, cur_fbr, cur_fbc,
                            sb_count);
  }
  error_info->setjmp = 0;
  return 1;
}